

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

string * __thiscall
google::protobuf::internal::ExtensionSet::MutableRepeatedString_abi_cxx11_
          (ExtensionSet *this,int number,int index)

{
  Extension *pEVar1;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar2;
  string_view str;
  LogMessage LStack_18;
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x266,"extension != nullptr");
    str._M_str = "Index out-of-bounds (field is empty).";
    str._M_len = 0x25;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&LStack_18,str)
    ;
    goto LAB_00282b3b;
  }
  if (pEVar1->is_repeated == false) {
    MutableRepeatedString_abi_cxx11_((ExtensionSet *)&LStack_18);
LAB_00282b2b:
    MutableRepeatedString_abi_cxx11_((ExtensionSet *)&LStack_18);
  }
  else {
    if ((byte)(pEVar1->type - 0x13) < 0xee) goto LAB_00282b2b;
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) == 9) {
      pVVar2 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         ((RepeatedPtrFieldBase *)pEVar1->field_0,index);
      return pVVar2;
    }
  }
  MutableRepeatedString_abi_cxx11_();
LAB_00282b3b:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_18)
  ;
}

Assistant:

std::string* ExtensionSet::MutableRepeatedString(int number, int index) {
  Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, STRING);
  return extension->ptr.repeated_string_value->Mutable(index);
}